

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

int nghttp2_frame_unpack_altsvc_payload2
              (nghttp2_extension *frame,uint8_t *payload,size_t payloadlen,nghttp2_mem *mem)

{
  uint16_t uVar1;
  uint8_t *dest;
  size_t origin_len;
  uint8_t *buf;
  nghttp2_mem *mem_local;
  size_t payloadlen_local;
  uint8_t *payload_local;
  nghttp2_extension *frame_local;
  
  if (payloadlen < 2) {
    frame_local._4_4_ = 6;
  }
  else {
    uVar1 = nghttp2_get_uint16(payload);
    dest = (uint8_t *)nghttp2_mem_malloc(mem,payloadlen - 2);
    if (dest == (uint8_t *)0x0) {
      frame_local._4_4_ = -0x385;
    }
    else {
      nghttp2_cpymem(dest,payload + 2,payloadlen - 2);
      nghttp2_frame_unpack_altsvc_payload(frame,(ulong)uVar1,dest,payloadlen - 2);
      frame_local._4_4_ = 0;
    }
  }
  return frame_local._4_4_;
}

Assistant:

int nghttp2_frame_unpack_altsvc_payload2(nghttp2_extension *frame,
                                         const uint8_t *payload,
                                         size_t payloadlen, nghttp2_mem *mem) {
  uint8_t *buf;
  size_t origin_len;

  if (payloadlen < 2) {
    return NGHTTP2_FRAME_SIZE_ERROR;
  }

  origin_len = nghttp2_get_uint16(payload);

  buf = nghttp2_mem_malloc(mem, payloadlen - 2);
  if (!buf) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_cpymem(buf, payload + 2, payloadlen - 2);

  nghttp2_frame_unpack_altsvc_payload(frame, origin_len, buf, payloadlen - 2);

  return 0;
}